

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  byte *pbVar5;
  
  lVar2 = -(long)ptr;
  do {
    pcVar3 = end + lVar2;
    if ((long)pcVar3 < 2) {
      return -1;
    }
    bVar1 = ((byte *)ptr)[1];
    if (0xdb < bVar1) {
      if (bVar1 == 0xff) {
        if (0xfd < (byte)*ptr) {
switchD_005f4383_caseD_0:
          *nextTokPtr = ptr;
          return 0;
        }
      }
      else if (bVar1 - 0xdc < 4) goto switchD_005f4383_caseD_0;
      goto switchD_005f4383_caseD_2;
    }
    if (bVar1 - 0xd8 < 4) {
switchD_005f4383_caseD_7:
      if (pcVar3 < (char *)0x4) {
        return -2;
      }
      pbVar5 = (byte *)ptr + 4;
      goto LAB_005f43a4;
    }
    if (bVar1 == 0) {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      switch(bVar1) {
      case 0:
      case 1:
      case 8:
        goto switchD_005f4383_caseD_0;
      default:
        goto switchD_005f4383_caseD_2;
      case 6:
        if (pcVar3 == (char *)0x2) {
          return -2;
        }
        pbVar5 = (byte *)ptr + 3;
        break;
      case 7:
        goto switchD_005f4383_caseD_7;
      case 0xc:
      case 0xd:
        pbVar5 = (byte *)ptr + 2;
        if ((uint)bVar1 == open) {
          if ((long)end - (long)pbVar5 < 2) {
            return -0x1b;
          }
          *nextTokPtr = (char *)pbVar5;
          if (((byte *)ptr)[3] != 0) {
            return 0;
          }
          uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
          if (0x1e < uVar4) {
            return 0;
          }
          if ((0x40300e00U >> (uVar4 & 0x1f) & 1) == 0) {
            return 0;
          }
          return 0x1b;
        }
      }
    }
    else {
switchD_005f4383_caseD_2:
      pbVar5 = (byte *)ptr + 2;
    }
LAB_005f43a4:
    lVar2 = -(long)pbVar5;
    ptr = (char *)pbVar5;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanLit)(int open, const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  while (HAS_CHAR(enc, ptr, end)) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
      INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (! HAS_CHAR(enc, ptr, end))
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_CR:
      case BT_LF:
      case BT_GT:
      case BT_PERCNT:
      case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}